

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

void __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::calculateIntersections(ComplexToSimple *this)

{
  Event *pEVar1;
  undefined8 uVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *node;
  long lVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *after;
  Edge *pEVar8;
  Node *pNVar9;
  long in_FS_OFFSET;
  bool bVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> pVar14;
  QIntersectionPoint p;
  Intersection local_a8;
  QIntersectionPoint local_70;
  QPodPoint local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  fillPriorityQueue(this);
  lVar5 = (this->m_events).siz;
  if (lVar5 != 0) {
    do {
      pEVar1 = (this->m_events).buffer + lVar5 + -1;
      local_48 = pEVar1->point;
      uStack_40._0_4_ = pEVar1->type;
      uStack_40._4_4_ = pEVar1->edge;
      sortEdgeList(this,local_48);
      pVar14 = bounds(this,&local_48);
      pNVar4 = pVar14.first;
      if (pNVar4 == (Node *)0x0) {
LAB_00445e1c:
        after = (Node *)0x0;
      }
      else {
        pNVar7 = pNVar4->left;
        pNVar3 = pNVar4;
        if (pNVar4->left == (Node *)0x0) {
          do {
            after = pNVar3->parent;
            if (after == (Node *)0x0) goto LAB_00445e1c;
            bVar10 = pNVar3 == after->left;
            pNVar3 = after;
          } while (bVar10);
        }
        else {
          do {
            after = pNVar7;
            pNVar7 = after->right;
          } while (after->right != (Node *)0x0);
        }
      }
      pEVar8 = (this->m_edges).buffer;
      pNVar7 = (Node *)(pEVar8 + uStack_40._4_4_);
      local_70.upperLeft = local_48;
      local_70.xOffset.numerator = 0;
      local_70.xOffset.denominator = 1;
      local_70.yOffset.numerator = 0;
      local_70.yOffset.denominator = 1;
      if (pNVar4 != (Node *)0x0) {
        splitEdgeListRange(this,pNVar4,pVar14.second,
                           *(int *)((long)&pNVar7->parent +
                                   (ulong)(byte)((int)uStack_40 == 0 ^
                                                 pEVar8[uStack_40._4_4_].pointingUp ^ 1) * 4),
                           &local_70);
        reorderEdgeListRange(this,pNVar4,pVar14.second);
        pNVar7 = pNVar4;
      }
LAB_00445e90:
      while (lVar5 = (this->m_events).siz, lVar5 != 0) {
        pEVar1 = (this->m_events).buffer;
        iVar12 = -(uint)(local_48.x == pEVar1[lVar5 + -1].point.x);
        iVar13 = -(uint)(local_48.y == pEVar1[lVar5 + -1].point.y);
        auVar11._4_4_ = iVar12;
        auVar11._0_4_ = iVar12;
        auVar11._8_4_ = iVar13;
        auVar11._12_4_ = iVar13;
        iVar12 = movmskpd((int)pNVar7,auVar11);
        if (iVar12 != 3) goto LAB_00446069;
        local_48 = pEVar1[lVar5 + -1].point;
        uVar2._0_4_ = pEVar1[lVar5 + -1].type;
        uVar2._4_4_ = pEVar1[lVar5 + -1].edge;
        (this->m_events).siz = lVar5 + -1;
        pEVar8 = (this->m_edges).buffer;
        pNVar7 = pEVar8[(int)uVar2._4_4_].node;
        uStack_40 = uVar2;
        if (pNVar7 == (Node *)0x0) goto LAB_00445f33;
        pNVar4 = pNVar7->left;
        pNVar3 = pNVar7;
        if (pNVar7->left == (Node *)0x0) {
          do {
            pNVar6 = pNVar3->parent;
            if (pNVar6 == (Node *)0x0) {
              pNVar6 = (Node *)0x0;
              break;
            }
            bVar10 = pNVar3 == pNVar6->left;
            pNVar3 = pNVar6;
          } while (bVar10);
        }
        else {
          do {
            pNVar6 = pNVar4;
            pNVar4 = pNVar6->right;
          } while (pNVar6->right != (Node *)0x0);
        }
        pNVar4 = pNVar7->right;
        pNVar3 = pNVar7;
        if (pNVar7->right == (Node *)0x0) {
          do {
            pNVar9 = pNVar3->parent;
            if (pNVar9 == (Node *)0x0) {
              pNVar9 = (Node *)0x0;
              break;
            }
            bVar10 = pNVar3 == pNVar9->right;
            pNVar3 = pNVar9;
          } while (bVar10);
        }
        else {
          do {
            pNVar9 = pNVar4;
            pNVar4 = pNVar9->left;
          } while (pNVar9->left != (Node *)0x0);
        }
        pEVar8 = pEVar8 + (int)uVar2._4_4_;
        QRBTree<int>::detach(&this->m_edgeList,pNVar7);
        pEVar8->node->right = (this->m_edgeList).freeList;
        (this->m_edgeList).freeList = pEVar8->node;
        pEVar8->node = (Node *)0x0;
        if ((pNVar6 != (Node *)0x0) && (pNVar9 != (Node *)0x0)) {
          uVar2._4_4_ = pNVar6->data;
          goto LAB_00446055;
        }
      }
      lVar5 = 0;
LAB_00446069:
      if ((this->m_topIntersection).m_data.siz != 0) {
        do {
          bVar10 = QIntersectionPoint::operator<
                             (&local_70,
                              &((this->m_topIntersection).m_data.buffer)->intersectionPoint);
          if (bVar10) break;
          QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::pop
                    (&local_a8,&this->m_topIntersection);
        } while ((this->m_topIntersection).m_data.siz != 0);
        lVar5 = (this->m_events).siz;
      }
    } while (lVar5 != 0);
  }
  lVar5 = (long)(this->m_processedEdgePairs).m_capacity;
  if (0 < lVar5) {
    memset((this->m_processedEdgePairs).m_array,0xff,lVar5 << 3);
  }
  (this->m_processedEdgePairs).m_count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_00445f33:
  pNVar3 = searchEdgeLeftOf(this,uVar2._4_4_,after);
  pNVar4 = (this->m_edgeList).freeList;
  if (pNVar4 == (Node *)0x0) {
    pNVar4 = (Node *)operator_new(0x28);
  }
  else {
    (this->m_edgeList).freeList = pNVar4->right;
  }
  pNVar4->parent = (Node *)0x0;
  pNVar4->left = (Node *)0x0;
  pNVar4->right = (Node *)0x0;
  pNVar4->red = true;
  (this->m_edges).buffer[(int)uVar2._4_4_].node = pNVar4;
  pNVar7 = pNVar3;
  QRBTree<int>::attachAfter(&this->m_edgeList,pNVar3,pNVar4);
  pNVar4 = (this->m_edges).buffer[(int)uVar2._4_4_].node;
  pNVar4->data = uVar2._4_4_;
  pNVar6 = pNVar4->right;
  if (pNVar4->right == (Node *)0x0) {
    do {
      pNVar9 = pNVar4->parent;
      if (pNVar9 == (Node *)0x0) {
        pNVar9 = (Node *)0x0;
        break;
      }
      bVar10 = pNVar4 == pNVar9->right;
      pNVar4 = pNVar9;
    } while (bVar10);
  }
  else {
    do {
      pNVar9 = pNVar6;
      pNVar6 = pNVar9->left;
    } while (pNVar9->left != (Node *)0x0);
  }
  if (pNVar3 != (Node *)0x0) {
    pNVar7 = (Node *)(ulong)(uint)pNVar3->data;
    calculateIntersection(this,pNVar3->data,uVar2._4_4_);
  }
  if (pNVar9 != (Node *)0x0) {
LAB_00446055:
    pNVar7 = (Node *)(ulong)uVar2._4_4_;
    calculateIntersection(this,uVar2._4_4_,pNVar9->data);
  }
  goto LAB_00445e90;
}

Assistant:

void QTriangulator<T>::ComplexToSimple::calculateIntersections()
{
    fillPriorityQueue();

    Q_ASSERT(m_topIntersection.empty());
    Q_ASSERT(m_edgeList.root == nullptr);

    // Find all intersection points.
    while (!m_events.isEmpty()) {
        Event event = m_events.last();
        sortEdgeList(event.point);

        // Find all edges in the edge list that contain the current vertex and mark them to be split later.
        std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> range = bounds(event.point);
        QRBTree<int>::Node *leftNode = range.first ? m_edgeList.previous(range.first) : nullptr;
        int vertex = (event.type == Event::Upper ? m_edges.at(event.edge).upper() : m_edges.at(event.edge).lower());
        QIntersectionPoint eventPoint = QT_PREPEND_NAMESPACE(qIntersectionPoint)(event.point);

        if (range.first != nullptr) {
            splitEdgeListRange(range.first, range.second, vertex, eventPoint);
            reorderEdgeListRange(range.first, range.second);
        }

        // Handle the edges with start or end point in the current vertex.
        while (!m_events.isEmpty() && m_events.last().point == event.point) {
            event = m_events.last();
            m_events.pop_back();
            int i = event.edge;

            if (m_edges.at(i).node) {
                // Remove edge from edge list.
                Q_ASSERT(event.type == Event::Lower);
                QRBTree<int>::Node *left = m_edgeList.previous(m_edges.at(i).node);
                QRBTree<int>::Node *right = m_edgeList.next(m_edges.at(i).node);
                m_edgeList.deleteNode(m_edges.at(i).node);
                if (!left || !right)
                    continue;
                calculateIntersection(left->data, right->data);
            } else {
                // Insert edge into edge list.
                Q_ASSERT(event.type == Event::Upper);
                QRBTree<int>::Node *left = searchEdgeLeftOf(i, leftNode);
                m_edgeList.attachAfter(left, m_edges.at(i).node = m_edgeList.newNode());
                m_edges.at(i).node->data = i;
                QRBTree<int>::Node *right = m_edgeList.next(m_edges.at(i).node);
                if (left)
                    calculateIntersection(left->data, i);
                if (right)
                    calculateIntersection(i, right->data);
            }
        }
        while (!m_topIntersection.isEmpty() && m_topIntersection.top().intersectionPoint <= eventPoint)
            m_topIntersection.pop();
#ifdef Q_TRIANGULATOR_DEBUG
        DebugDialog dialog(this, vertex);
        dialog.exec();
#endif
    }
    m_processedEdgePairs.clear();
}